

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O3

char * deqp::getFloatFractionUniformName(int number)

{
  if (number - 1U < 8) {
    return &DAT_01b8069c + *(int *)(&DAT_01b8069c + (ulong)(number - 1U) * 4);
  }
  return glcts::fixed_sample_locations_values + 1;
}

Assistant:

const char* getFloatFractionUniformName(int number)
{
	switch (number)
	{
	case 1:
		return "uf_one";
	case 2:
		return "uf_half";
	case 3:
		return "uf_third";
	case 4:
		return "uf_fourth";
	case 5:
		return "uf_fifth";
	case 6:
		return "uf_sixth";
	case 7:
		return "uf_seventh";
	case 8:
		return "uf_eighth";
	default:
		DE_ASSERT(false);
		return "";
	}
}